

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

s3wid_t dict_wordid(dict_t *d,char *word)

{
  int32 iVar1;
  undefined8 in_RAX;
  int32 w;
  
  w = (int32)((ulong)in_RAX >> 0x20);
  if (d == (dict_t *)0x0) {
    __assert_fail("d",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                  ,0x191,"s3wid_t dict_wordid(dict_t *, const char *)");
  }
  if (word == (char *)0x0) {
    __assert_fail("word",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                  ,0x192,"s3wid_t dict_wordid(dict_t *, const char *)");
  }
  iVar1 = hash_table_lookup_int32(d->ht,word,&w);
  if (iVar1 < 0) {
    w = -1;
  }
  return w;
}

Assistant:

s3wid_t
dict_wordid(dict_t *d, const char *word)
{
    int32 w;

    assert(d);
    assert(word);

    if (hash_table_lookup_int32(d->ht, word, &w) < 0)
        return (BAD_S3WID);
    return w;
}